

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_schema.c
# Opt level: O0

int32_t tnt_schema_stoiid(tnt_schema *schema_obj,uint32_t sid,char *name,uint32_t name_len)

{
  mh_int_t mVar1;
  assoc_val **ppaVar2;
  tnt_schema_ival *index;
  undefined1 auStack_68 [4];
  mh_int_t index_slot;
  assoc_key index_key;
  tnt_schema_sval *space;
  undefined1 auStack_48 [4];
  mh_int_t space_slot;
  assoc_key space_key;
  mh_assoc_t *schema;
  uint32_t name_len_local;
  char *name_local;
  tnt_schema *ptStack_18;
  uint32_t sid_local;
  tnt_schema *schema_obj_local;
  
  space_key._8_8_ = schema_obj->space_hash;
  _auStack_48 = (char *)((long)&name_local + 4);
  space_key.id._0_4_ = 4;
  name_local._4_4_ = sid;
  ptStack_18 = schema_obj;
  mVar1 = mh_assoc_find((mh_assoc_t *)space_key._8_8_,(assoc_key *)auStack_48,(void *)0x0);
  if (mVar1 == *(mh_int_t *)(space_key._8_8_ + 0x10)) {
    schema_obj_local._4_4_ = -1;
  }
  else {
    ppaVar2 = mh_assoc_node((mh_assoc_t *)space_key._8_8_,mVar1);
    index_key._8_8_ = (*ppaVar2)->data;
    _auStack_68 = name;
    index_key.id._0_4_ = name_len;
    mVar1 = mh_assoc_find(*(mh_assoc_t **)(index_key._8_8_ + 0x10),(assoc_key *)auStack_68,
                          (void *)0x0);
    if (mVar1 == *(mh_int_t *)(*(long *)(index_key._8_8_ + 0x10) + 0x10)) {
      schema_obj_local._4_4_ = -1;
    }
    else {
      ppaVar2 = mh_assoc_node(*(mh_assoc_t **)(index_key._8_8_ + 0x10),mVar1);
      schema_obj_local._4_4_ = *(int32_t *)((long)(*ppaVar2)->data + 0xc);
    }
  }
  return schema_obj_local._4_4_;
}

Assistant:

int32_t tnt_schema_stoiid(struct tnt_schema *schema_obj, uint32_t sid,
			  const char *name, uint32_t name_len) {
	struct mh_assoc_t *schema = schema_obj->space_hash;
	struct assoc_key space_key = {(void *)&sid, sizeof(uint32_t)};
	mh_int_t space_slot = mh_assoc_find(schema, &space_key, NULL);
	if (space_slot == mh_end(schema))
		return -1;
	const struct tnt_schema_sval *space =
		(*mh_assoc_node(schema, space_slot))->data;
	struct assoc_key index_key = {name, name_len};
	mh_int_t index_slot = mh_assoc_find(space->index, &index_key, NULL);
	if (index_slot == mh_end(space->index))
		return -1;
	const struct tnt_schema_ival *index =
		(*mh_assoc_node(space->index, index_slot))->data;
	return index->number;
}